

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.hpp
# Opt level: O0

void __thiscall
helics::ForwardingTimeCoordinator::ForwardingTimeCoordinator(ForwardingTimeCoordinator *this)

{
  BaseTimeCoordinator *in_RDI;
  
  BaseTimeCoordinator::BaseTimeCoordinator(in_RDI);
  in_RDI->_vptr_BaseTimeCoordinator = (_func_int **)&PTR__ForwardingTimeCoordinator_0092f750;
  DependencyInfo::DependencyInfo((DependencyInfo *)in_RDI);
  DependencyInfo::DependencyInfo((DependencyInfo *)in_RDI);
  *(undefined1 *)&in_RDI[3]._vptr_BaseTimeCoordinator = 0;
  *(undefined1 *)((long)&in_RDI[3]._vptr_BaseTimeCoordinator + 1) = 0;
  *(undefined4 *)((long)&in_RDI[3]._vptr_BaseTimeCoordinator + 4) = 0;
  return;
}

Assistant:

ForwardingTimeCoordinator() = default;